

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingDistributions.cpp
# Opt level: O1

tuple<float,_float> getMoments(vector<float,_std::allocator<float>_> *results)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *in_RSI;
  float *pfVar3;
  float fVar4;
  double dVar5;
  _Head_base<0UL,_float,_false> _Var7;
  tuple<float,_float> tVar6;
  float fVar8;
  
  pfVar2 = (float *)*in_RSI;
  pfVar1 = (float *)in_RSI[1];
  if (pfVar2 == pfVar1) {
    fVar4 = 0.0;
    _Var7._M_head_impl = 0.0;
  }
  else {
    dVar5 = 0.0;
    pfVar3 = pfVar2;
    do {
      dVar5 = dVar5 + (double)*pfVar3;
      pfVar3 = pfVar3 + 1;
    } while (pfVar3 != pfVar1);
    _Var7._M_head_impl = (float)((ulong)dVar5 >> 0x20);
    fVar4 = (float)dVar5;
  }
  fVar8 = (float)(ulong)((long)pfVar1 - (long)pfVar2 >> 2);
  tVar6.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar4 / fVar8;
  tVar6.super__Tuple_impl<0UL,_float,_float>.super__Head_base<0UL,_float,_false>._M_head_impl =
       _Var7._M_head_impl;
  fVar4 = 0.0;
  for (; pfVar1 != pfVar2; pfVar2 = pfVar2 + 1) {
    fVar4 = fVar4 + (*pfVar2 -
                    tVar6.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
                    super__Head_base<1UL,_float,_false>._M_head_impl) *
                    (*pfVar2 -
                    tVar6.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
                    super__Head_base<1UL,_float,_false>._M_head_impl);
  }
  *(float *)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start = fVar4 / fVar8;
  ((_Head_base<1UL,_float,_false> *)
  ((long)&(results->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start + 4))->_M_head_impl =
       tVar6.super__Tuple_impl<0UL,_float,_float>.super__Tuple_impl<1UL,_float>.
       super__Head_base<1UL,_float,_false>._M_head_impl;
  return (tuple<float,_float>)tVar6.super__Tuple_impl<0UL,_float,_float>;
}

Assistant:

std::tuple<float, float> getMoments (std::vector <float> results){
	float sum = std::accumulate(results.begin(), results.end(), 0.0);
	float mean = sum / results.size();

	float sq_sum = 0.0;
	for (float x: results){
		sq_sum += (x-mean)*(x-mean);
	}
	float variance = sq_sum / results.size();

	return std::make_tuple(mean, variance);
}